

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  int *piVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  float *pfVar5;
  ImGuiStyleMod *__dest;
  ImGuiContext *pIVar6;
  int iVar7;
  int iVar8;
  ImGuiStyleMod *pIVar9;
  
  pIVar3 = GImGui;
  pfVar5 = GetStyleVarFloatAddr(idx);
  if (pfVar5 == (float *)0x0) {
    __assert_fail("pvar != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x124d,"void ImGui::PushStyleVar(ImGuiStyleVar, float)");
  }
  fVar2 = *pfVar5;
  iVar4 = (pIVar3->StyleModifiers).Size;
  if (iVar4 != (pIVar3->StyleModifiers).Capacity) {
    __dest = (pIVar3->StyleModifiers).Data;
    goto LAB_00129df7;
  }
  if (iVar4 == 0) {
    iVar7 = 8;
  }
  else {
    iVar7 = iVar4 / 2 + iVar4;
  }
  iVar8 = iVar4 + 1;
  if (iVar4 + 1 < iVar7) {
    iVar8 = iVar7;
  }
  piVar1 = &(pIVar3->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (ImGuiStyleMod *)(*(pIVar3->IO).MemAllocFn)((long)iVar8 * 0xc);
  pIVar9 = (pIVar3->StyleModifiers).Data;
  if (pIVar9 == (ImGuiStyleMod *)0x0) {
LAB_00129dd1:
    pIVar9 = (ImGuiStyleMod *)0x0;
    pIVar6 = GImGui;
  }
  else {
    memcpy(__dest,pIVar9,(long)(pIVar3->StyleModifiers).Size * 0xc);
    pIVar6 = GImGui;
    pIVar9 = (pIVar3->StyleModifiers).Data;
    if (pIVar9 == (ImGuiStyleMod *)0x0) goto LAB_00129dd1;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar6->IO).MemFreeFn)(pIVar9);
  (pIVar3->StyleModifiers).Data = __dest;
  (pIVar3->StyleModifiers).Capacity = iVar8;
  iVar4 = (pIVar3->StyleModifiers).Size;
LAB_00129df7:
  (pIVar3->StyleModifiers).Size = iVar4 + 1;
  __dest[iVar4].Var = idx;
  __dest[iVar4].PreviousValue.x = fVar2;
  __dest[iVar4].PreviousValue.y = 0.0;
  *pfVar5 = val;
  return;
}

Assistant:

void ImGui::PushStyleVar(ImGuiStyleVar idx, float val)
{
    ImGuiContext& g = *GImGui;
    float* pvar = GetStyleVarFloatAddr(idx);
    IM_ASSERT(pvar != NULL); // Called function with wrong-type? Variable is not a float.
    ImGuiStyleMod backup;
    backup.Var = idx;
    backup.PreviousValue = ImVec2(*pvar, 0.0f);
    g.StyleModifiers.push_back(backup);
    *pvar = val;
}